

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O3

void __thiscall
Js::StackScriptFunction::BoxState::BoxNativeFrame
          (BoxState *this,JavascriptStackWalker *walker,FunctionBody *callerFunctionBody)

{
  ImplicitCallFlags *pIVar1;
  short sVar2;
  void *pvVar3;
  Var *this_00;
  JavascriptStackWalker *this_01;
  FrameDisplay *pFVar4;
  bool bVar5;
  void **ppvVar6;
  StackScriptFunction *obj;
  StackScriptFunction *this_02;
  ScriptContext *pSVar7;
  IRecyclerVisitedObject aValue;
  void *local_58;
  Var *boxedScopeSlots;
  JavascriptStackWalker *local_48;
  FunctionProxy *local_40;
  FrameDisplay *stackFrameDisplay;
  Var *stackScopeSlots;
  
  boxedScopeSlots = (Var *)callerFunctionBody;
  local_48 = walker;
  if ((walker->field_0x50 & 1) == 0) {
    ppvVar6 = JavascriptStackWalker::GetCurrentArgv(walker);
    aValue._vptr_IRecyclerVisitedObject =
         *(_func_int ***)
          ((long)ppvVar6 +
          ((ulong)(*(short *)(boxedScopeSlots + 10) == 0) << 3 | 0xffffffffffffffe0));
    if (aValue._vptr_IRecyclerVisitedObject != (_func_int **)0x0) {
      do {
        obj = VarTo<Js::StackScriptFunction>(aValue._vptr_IRecyclerVisitedObject);
        this_02 = VarTo<Js::StackScriptFunction,Js::ScriptFunction>(&obj->super_ScriptFunction);
        local_40 = ScriptFunction::GetFunctionProxy(&this_02->super_ScriptFunction);
        bVar5 = JsUtil::
                BaseDictionary<Js::FunctionProxy_*,_Js::FunctionProxy_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(&(this->functionObjectToBox).
                               super_BaseDictionary<Js::FunctionProxy_*,_Js::FunctionProxy_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                              ,&local_40);
        if (bVar5) {
          BoxStackFunction(this,&this_02->super_ScriptFunction);
        }
        aValue._vptr_IRecyclerVisitedObject =
             obj[1].super_ScriptFunction.super_ScriptFunctionBase.super_JavascriptFunction.
             super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
      } while (aValue._vptr_IRecyclerVisitedObject != (_func_int **)0x0);
    }
  }
  this_01 = local_48;
  this_00 = boxedScopeSlots;
  sVar2 = *(short *)(boxedScopeSlots + 10);
  ppvVar6 = JavascriptStackWalker::GetCurrentArgv(local_48);
  local_40 = (FunctionProxy *)ppvVar6[(ulong)(sVar2 == 0) - 5];
  bVar5 = ThreadContext::IsOnStack(local_40);
  if (bVar5) {
    stackFrameDisplay = (FrameDisplay *)0x0;
    bVar5 = JsUtil::
            BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<Js::FrameDisplay*>
                      ((BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&this->boxedValues,(FrameDisplay **)&local_40,&stackFrameDisplay);
    pFVar4 = stackFrameDisplay;
    if (bVar5) {
      sVar2 = *(short *)(this_00 + 10);
      ppvVar6 = JavascriptStackWalker::GetCurrentArgv(this_01);
      ppvVar6[(ulong)(sVar2 == 0) - 5] = pFVar4;
      pSVar7 = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
      pIVar1 = &pSVar7->threadContext->implicitCallFlags;
      *pIVar1 = *pIVar1 | ImplicitCall_Accessor;
    }
  }
  sVar2 = *(short *)(this_00 + 10);
  ppvVar6 = JavascriptStackWalker::GetCurrentArgv(this_01);
  stackFrameDisplay =
       *(FrameDisplay **)((long)ppvVar6 + ((ulong)(sVar2 == 0) << 3 | 0xffffffffffffffd0));
  bVar5 = ThreadContext::IsOnStack(stackFrameDisplay);
  if (bVar5) {
    local_58 = (void *)0x0;
    bVar5 = JsUtil::
            BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<void**>
                      ((BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&this->boxedValues,(void ***)&stackFrameDisplay,&local_58);
    pvVar3 = local_58;
    if (bVar5) {
      sVar2 = *(short *)(this_00 + 10);
      ppvVar6 = JavascriptStackWalker::GetCurrentArgv(this_01);
      *(void **)((long)ppvVar6 + ((ulong)(sVar2 == 0) << 3 | 0xffffffffffffffd0)) = pvVar3;
      pSVar7 = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
      pIVar1 = &pSVar7->threadContext->implicitCallFlags;
      *pIVar1 = *pIVar1 | ImplicitCall_Accessor;
    }
  }
  return;
}

Assistant:

void StackScriptFunction::BoxState::BoxNativeFrame(JavascriptStackWalker const& walker, FunctionBody * callerFunctionBody)
    {
        this->ForEachStackNestedFunctionNative(walker, callerFunctionBody, [&](ScriptFunction *curr)
        {
            StackScriptFunction * func = VarTo<StackScriptFunction>(curr);
            // Need to check if we need the script function as the list of script function
            // include inlinee stack function that doesn't necessary need to be boxed
            if (this->NeedBoxScriptFunction(func))
            {
                // Box the stack function, even if they might not be "created" in the byte code yet.
                // Some of them will not be captured in slots, so we just need to box them and record it with the
                // stack func so that when we can just use the boxed value when we need it.
                this->BoxStackFunction(func);
            }
        });

        // Write back the boxed stack closure pointers at the designated stack locations.
        Js::FrameDisplay *stackFrameDisplay = this->GetFrameDisplayFromNativeFrame(walker, callerFunctionBody);
        if (ThreadContext::IsOnStack(stackFrameDisplay))
        {
            Js::FrameDisplay *boxedFrameDisplay = nullptr;
            if (boxedValues.TryGetValue(stackFrameDisplay, (void**)&boxedFrameDisplay))
            {
                this->SetFrameDisplayFromNativeFrame(walker, callerFunctionBody, boxedFrameDisplay);
                callerFunctionBody->GetScriptContext()->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_Accessor);
            }
        }

        Var              *stackScopeSlots = this->GetScopeSlotsFromNativeFrame(walker, callerFunctionBody);
        if (ThreadContext::IsOnStack(stackScopeSlots))
        {
            Var              *boxedScopeSlots = nullptr;
            if (boxedValues.TryGetValue(stackScopeSlots, (void**)&boxedScopeSlots))
            {
                this->SetScopeSlotsFromNativeFrame(walker, callerFunctionBody, boxedScopeSlots);
                callerFunctionBody->GetScriptContext()->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_Accessor);
            }
        }
    }